

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawstr.c
# Opt level: O3

int Curl_raw_nequal(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  
  cVar1 = *first;
  if (cVar1 != '\0') {
    pcVar4 = first + 1;
    do {
      cVar2 = *second;
      if ((cVar2 == '\0') || (max == 0)) goto LAB_00123f15;
      cVar1 = Curl_raw_toupper(cVar1);
      cVar2 = Curl_raw_toupper(cVar2);
      if (cVar1 != cVar2) goto LAB_00123f2e;
      max = max - 1;
      second = second + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  cVar1 = '\0';
LAB_00123f15:
  if (max == 0) {
    uVar3 = 1;
  }
  else {
    cVar2 = *second;
    cVar1 = Curl_raw_toupper(cVar1);
    cVar2 = Curl_raw_toupper(cVar2);
LAB_00123f2e:
    uVar3 = (uint)(cVar1 == cVar2);
  }
  return uVar3;
}

Assistant:

int Curl_raw_nequal(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return Curl_raw_toupper(*first) == Curl_raw_toupper(*second);
}